

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_iterator.hpp
# Opt level: O0

void __thiscall
jsoncons::
staj_array_iterator<ns::employee_NCGN,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::next(staj_array_iterator<ns::employee_NCGN,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *this,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  ulong uVar3;
  basic_staj_event<char> *this_00;
  error_code *in_RSI;
  exception_ptr *in_RDI;
  conv_error *anon_var_0;
  error_code *in_stack_00000038;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_00000040;
  basic_staj_cursor<char> *in_stack_00000048;
  employee_NCGN *in_stack_ffffffffffffff98;
  optional<ns::employee_NCGN> *in_stack_ffffffffffffffa0;
  exception_ptr local_18;
  error_code *local_10;
  
  if (((ulong)in_RDI[1]._M_exception_object & 1) == 0) {
    local_10 = in_RSI;
    uVar3 = (**(code **)(**in_RDI->_M_exception_object + 0x18))();
    if ((uVar3 & 1) == 0) {
      (**(code **)(**in_RDI->_M_exception_object + 0x40))(*in_RDI->_M_exception_object,local_10);
      bVar1 = std::error_code::operator_cast_to_bool(local_10);
      if (bVar1) {
        *(undefined1 *)&in_RDI[1]._M_exception_object = 1;
      }
      else {
        this_00 = (basic_staj_event<char> *)(**(code **)(**in_RDI->_M_exception_object + 0x20))();
        sVar2 = basic_staj_event<char>::event_type(this_00);
        if (sVar2 == end_array) {
          *(undefined1 *)&in_RDI[1]._M_exception_object = 1;
        }
        else {
          std::__exception_ptr::exception_ptr::exception_ptr(&local_18);
          std::__exception_ptr::exception_ptr::operator=
                    ((exception_ptr *)in_stack_ffffffffffffffa0,
                     (exception_ptr *)in_stack_ffffffffffffff98);
          std::__exception_ptr::exception_ptr::~exception_ptr(in_RDI);
          decode_traits<ns::employee_NCGN,char,void>::
          decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038);
          std::optional<ns::employee_NCGN>::operator=
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          ::ns::employee_NCGN::~employee_NCGN((employee_NCGN *)0xd59279);
        }
      }
    }
    else {
      *(undefined1 *)&in_RDI[1]._M_exception_object = 1;
    }
  }
  return;
}

Assistant:

void next(std::error_code& ec)
        {
            if (JSONCONS_UNLIKELY(done_))
            {
                return;
            }
            if (view_->cursor_->done())
            {
                done_ = true;
                return;
            }
            view_->cursor_->next(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                done_ = true;
                return;
            }
            if (JSONCONS_UNLIKELY(view_->cursor_->current().event_type() == staj_event_type::end_array))
            {
                done_ = true;
                return;
            }
            eptr_ = std::exception_ptr();
            JSONCONS_TRY
            {
                view_->value_ = decode_traits<T,char_type>::decode(*view_->cursor_, view_->decoder_, ec);
            }